

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::alphaHullInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction)

{
  RealType RVar1;
  _func_void__Op_any_ptr__Arg_ptr *p_Var2;
  char *pcVar3;
  int iVar4;
  type_info *ptVar5;
  float *pfVar6;
  int *piVar7;
  float fVar8;
  any alphaSpec;
  _Arg __arg;
  any local_88;
  _Arg local_78;
  undefined8 uStack_70;
  long local_68 [2];
  _Arg local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  _Arg local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  createSelectionSets((SelectionSet *)&local_58,this);
  local_88._M_storage._M_ptr = (void *)0x0;
  p_Var2 = (instruction->value)._M_manager;
  if (p_Var2 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  else {
    local_78._M_obj = &local_88;
    (*p_Var2)(_Op_clone,&instruction->value,&local_78);
  }
  ptVar5 = std::any::type(&local_88);
  pcVar3 = *(char **)(ptVar5 + 8);
  if (pcVar3 == _seekoff) {
LAB_00202adb:
    pfVar6 = (float *)std::__any_caster<float>(&local_88);
    if (pfVar6 == (float *)0x0) goto LAB_00202bf0;
    fVar8 = *pfVar6;
    goto LAB_00202b07;
  }
  if (*pcVar3 != '*') {
    iVar4 = strcmp(pcVar3,_seekoff);
    if (iVar4 == 0) goto LAB_00202adb;
  }
  ptVar5 = std::any::type(&local_88);
  pcVar3 = *(char **)(ptVar5 + 8);
  if (pcVar3 == _put) {
LAB_00202af2:
    piVar7 = (int *)std::__any_caster<int>(&local_88);
    if (piVar7 == (int *)0x0) {
LAB_00202bf0:
      std::__throw_bad_any_cast();
    }
    fVar8 = (float)*piVar7;
  }
  else {
    if (*pcVar3 != '*') {
      iVar4 = strcmp(pcVar3,_put);
      if (iVar4 == 0) goto LAB_00202af2;
    }
    local_78._M_obj = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"casting error in alphaHullInstruction","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_78._M_obj);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((long *)local_78._M_obj != local_68) {
      operator_delete(local_78._M_obj,local_68[0] + 1);
    }
    SelectionSet::clearAll((SelectionSet *)&local_58);
    fVar8 = 0.0;
  }
LAB_00202b07:
  AlphaHullFinder::setAlpha(&this->alphaHullFinder,(double)fVar8);
  HullFinder::findHull((SelectionSet *)&local_38,&(this->alphaHullFinder).super_HullFinder);
  local_68[0] = local_48;
  uStack_70 = uStack_50;
  local_78 = local_58;
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_48 = local_28;
  local_38._M_obj = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_78);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_38);
  RVar1 = (this->alphaHullFinder).super_HullFinder.volume_;
  this->surfaceArea_ = (this->alphaHullFinder).super_HullFinder.surfaceArea_;
  this->hasSurfaceArea_ = true;
  this->volume_ = RVar1;
  this->hasVolume_ = true;
  SelectionSet::parallelReduce(__return_storage_ptr__,(SelectionSet *)&local_58);
  if (local_88._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_88._M_manager)(_Op_destroy,&local_88,(_Arg *)0x0);
    local_88._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::alphaHullInstruction(
      const Token& instruction) {
    SelectionSet bs = createSelectionSets();

    std::any alphaSpec = instruction.value;
    float alpha(0.0);
    if (alphaSpec.type() == typeid(float)) {
      alpha = std::any_cast<float>(alphaSpec);
    } else if (alphaSpec.type() == typeid(int)) {
      alpha = std::any_cast<int>(alphaSpec);
    } else {
      evalError("casting error in alphaHullInstruction");
      bs.clearAll();
    }

    alphaHullFinder.setAlpha(alpha);
    bs              = alphaHullFinder.findHull();
    surfaceArea_    = alphaHullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = alphaHullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }